

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall
helics::CommonCore::sendAt
          (CommonCore *this,InterfaceHandle sourceHandle,void *data,uint64_t length,Time time)

{
  string_view string2;
  string_view message_00;
  string_view message_01;
  string_view string1;
  string_view string3;
  bool bVar1;
  GlobalFederateId GVar2;
  pair<helics::route_id,_helics::ActionMessage> *this_00;
  undefined8 uVar3;
  char *pcVar4;
  FederateState *this_01;
  TimeRepresentation<count_time<9,_long>_> *__str;
  size_t in_RDI;
  __sv_type _Var5;
  vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *in_stack_00000040;
  ActionMessage *in_stack_00000048;
  CommonCore *in_stack_00000050;
  Time minTime;
  ActionMessage message;
  vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  targets;
  FederateState *fed;
  pair<helics::route_id,_helics::ActionMessage> *hndl;
  CommonCore *in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  ActionMessage *this_02;
  char *in_stack_fffffffffffffe48;
  Time in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe58;
  action_t in_stack_fffffffffffffe5c;
  ActionMessage *in_stack_fffffffffffffe60;
  CommonCore *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  LocalFederateId in_stack_fffffffffffffe84;
  InterfaceHandle handle;
  undefined1 in_stack_fffffffffffffe88 [16];
  
  handle.hid = in_stack_fffffffffffffe88._4_4_;
  this_00 = getHandleInfo(in_stack_fffffffffffffe38,
                          (InterfaceHandle)(BaseType)((ulong)in_stack_fffffffffffffe40 >> 0x20));
  if (this_00 == (pair<helics::route_id,_helics::ActionMessage> *)0x0) {
    uVar3 = __cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               in_stack_fffffffffffffe50.internalTimeCode,in_stack_fffffffffffffe48);
    message_00._M_len._4_4_ = in_stack_fffffffffffffe5c;
    message_00._M_len._0_4_ = in_stack_fffffffffffffe58;
    message_00._M_str = (char *)in_stack_fffffffffffffe60;
    InvalidIdentifier::InvalidIdentifier
              ((InvalidIdentifier *)in_stack_fffffffffffffe50.internalTimeCode,message_00);
    __cxa_throw(uVar3,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
  }
  if ((char)(this_00->second).messageID == 'e') {
    this_01 = getFederateAt(in_stack_fffffffffffffe78,in_stack_fffffffffffffe84);
    FederateState::getMessageDestinations
              ((FederateState *)CONCAT44(in_stack_fffffffffffffe84.fid,in_stack_fffffffffffffe80),
               handle);
    bVar1 = std::
            vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            ::empty((vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                     *)in_stack_fffffffffffffe50.internalTimeCode);
    if (!bVar1) {
      ActionMessage::ActionMessage(in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
      GVar2 = BasicHandleInfo::getFederateId((BasicHandleInfo *)this_00);
      in_stack_fffffffffffffe50 = FederateState::nextAllowedSendTime(this_01);
      __str = std::max<TimeRepresentation<count_time<9,long>>>
                        ((TimeRepresentation<count_time<9,_long>_> *)in_stack_fffffffffffffe38,
                         (TimeRepresentation<count_time<9,_long>_> *)0x53df30);
      SmallBuffer::assign((SmallBuffer *)in_stack_fffffffffffffe50.internalTimeCode,__str,
                          (size_t)in_stack_fffffffffffffe40);
      std::__atomic_base<int>::operator++((__atomic_base<int> *)(in_RDI + 0x540));
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 in_stack_fffffffffffffe50.internalTimeCode,(char *)__str);
      std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffe40);
      _Var5 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffe40);
      this_02 = (ActionMessage *)_Var5._M_str;
      string1._M_len._4_4_ = GVar2.gid;
      string1._M_len._0_4_ = in_stack_fffffffffffffe58;
      string1._M_str = (char *)in_stack_fffffffffffffe60;
      string2._M_str = (char *)in_stack_fffffffffffffe50.internalTimeCode;
      string2._M_len = (size_t)__str;
      string3._M_str = (char *)_Var5._M_len;
      string3._M_len = in_RDI;
      ActionMessage::setStringData(this_02,string1,string2,string3);
      generateMessages(in_stack_00000050,in_stack_00000048,in_stack_00000040);
      ActionMessage::~ActionMessage(this_02);
    }
    std::
    vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
    ::~vector((vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
               *)in_stack_fffffffffffffe50.internalTimeCode);
    return;
  }
  pcVar4 = (char *)__cxa_allocate_exception(0x28);
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             in_stack_fffffffffffffe50.internalTimeCode,in_stack_fffffffffffffe48);
  message_01._M_len._4_4_ = in_stack_fffffffffffffe5c;
  message_01._M_len._0_4_ = in_stack_fffffffffffffe58;
  message_01._M_str = pcVar4;
  InvalidIdentifier::InvalidIdentifier
            ((InvalidIdentifier *)in_stack_fffffffffffffe50.internalTimeCode,message_01);
  __cxa_throw(pcVar4,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
}

Assistant:

void CommonCore::sendAt(InterfaceHandle sourceHandle, const void* data, uint64_t length, Time time)
{
    const auto* hndl = getHandleInfo(sourceHandle);
    if (hndl == nullptr) {
        throw(InvalidIdentifier("handle is not valid"));
    }
    if (hndl->handleType != InterfaceType::ENDPOINT) {
        throw(InvalidIdentifier("handle does not point to an endpoint"));
    }
    auto* fed = getFederateAt(hndl->local_fed_id);
    auto targets = fed->getMessageDestinations(sourceHandle);
    if (targets.empty()) {
        return;
    }

    ActionMessage message(CMD_SEND_MESSAGE);
    message.source_handle = sourceHandle;
    message.source_id = hndl->getFederateId();
    auto minTime = fed->nextAllowedSendTime();
    message.actionTime = std::max(time, minTime);
    message.payload.assign(data, length);
    message.messageID = ++messageCounter;
    message.setStringData("", hndl->key, hndl->key);
    generateMessages(message, targets);
}